

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O3

SPxId __thiscall
soplex::SPxBoundFlippingRT<double>::selectEnter
          (SPxBoundFlippingRT<double> *this,double *val,int leaveIdx,bool polish)

{
  int iVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<double> *pSVar4;
  UpdateVector<double> *pUVar5;
  double *vec;
  double *upd;
  double *low;
  double *upp;
  pointer pBVar6;
  pointer pBVar7;
  Item *pIVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  BreakpointSource BVar10;
  int iVar11;
  SPxId SVar12;
  pointer pdVar13;
  double *pdVar14;
  undefined8 uVar15;
  pointer pdVar16;
  long lVar17;
  Nonzero<double> *pNVar18;
  uint uVar19;
  long lVar20;
  UpdateVector<double> *pUVar21;
  Breakpoint *pBVar22;
  double *upd_00;
  double *vec_00;
  double *pdVar23;
  uint uVar24;
  long lVar25;
  bool bVar26;
  ulong uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  int *piVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double *low_00;
  double *low_01;
  double *upp_00;
  double *upp_01;
  int nBp;
  double local_e8;
  uint local_e0;
  int minIdx;
  int *local_d8;
  undefined8 uStack_d0;
  double local_c0;
  uint local_b8;
  int local_b4;
  SPxId enterId;
  double local_a8;
  BreakpointCompare local_50;
  Breakpoint tmp;
  
  pSVar4 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
  if ((pSVar4->leaveCount * -0x3d70a3d7 + 0x51eb850U >> 2 | pSVar4->leaveCount * 0x40000000) <
      0x28f5c29) {
    this->flipPotential = 1.0;
  }
  if ((((this->super_SPxFastRT<double>).field_0x51 != '\x01' || polish) || (pSVar4->theRep == ROW))
     || (this->flipPotential <= 0.0)) {
    SVar12 = SPxFastRT<double>::selectEnter(&this->super_SPxFastRT<double>,val,leaveIdx,polish);
    return (SPxId)SVar12.super_DataKey;
  }
  pUVar21 = pSVar4->theCoPvec;
  pUVar5 = pSVar4->thePvec;
  pdVar23 = (pUVar5->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  upd_00 = (pUVar5->thedelta).super_VectorBase<double>.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar30 = (pUVar5->thedelta).super_IdxSet.idx;
  iVar11 = (pUVar5->thedelta).super_IdxSet.num;
  low_01 = (pSVar4->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  upp_01 = (pSVar4->theUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  vec = (pUVar21->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start;
  upd = (pUVar21->thedelta).super_VectorBase<double>.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ;
  local_d8 = (pUVar21->thedelta).super_IdxSet.idx;
  local_e8 = (double)CONCAT44(local_e8._4_4_,(pUVar21->thedelta).super_IdxSet.num);
  low = (pSVar4->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  upp = (pSVar4->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  local_c0 = *val;
  *val = 0.0;
  nBp = 0;
  minIdx = -1;
  local_b4 = leaveIdx;
  if (local_c0 <= 0.0) {
    collectBreakpointsMin(this,&nBp,&minIdx,piVar30,iVar11,upd_00,pdVar23,upp_01,low_01,PVEC);
    collectBreakpointsMin(this,&nBp,&minIdx,local_d8,local_e8._0_4_,upd,vec,upp,low,COPVEC);
  }
  else {
    collectBreakpointsMax(this,&nBp,&minIdx,piVar30,iVar11,upd_00,pdVar23,upp_01,low_01,PVEC);
    collectBreakpointsMax(this,&nBp,&minIdx,local_d8,local_e8._0_4_,upd,vec,upp,low,COPVEC);
  }
  if (nBp == 0) {
    *val = local_c0;
  }
  else {
    pBVar6 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar7 = pBVar6 + minIdx;
    tmp.val = pBVar7->val;
    tmp.idx = pBVar7->idx;
    tmp.src = pBVar7->src;
    iVar11 = pBVar6->idx;
    BVar10 = pBVar6->src;
    pBVar7 = pBVar6 + minIdx;
    pBVar7->val = pBVar6->val;
    pBVar7->idx = iVar11;
    pBVar7->src = BVar10;
    pBVar7 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar7->val = tmp.val;
    pBVar7->idx = tmp.idx;
    pBVar7->src = tmp.src;
    pSVar4 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
    dVar31 = (pSVar4->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[local_b4];
    dVar35 = 0.0;
    if ((dVar31 == 0.0) && (!NAN(dVar31))) {
      dVar31 = pSVar4->instableLeaveVal;
    }
    piVar30 = (int *)ABS(dVar31);
    local_50.entry =
         (this->breakpoints).data.
         super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
         ._M_impl.super__Vector_impl_data._M_start;
    iVar11 = 0;
    uVar19 = 0xffffffff;
    bVar26 = 0 < nBp;
    if ((0 < nBp) && (0.0 < (double)piVar30)) {
      iVar11 = 0;
      lVar25 = 8;
      uStack_d0 = 0;
      uVar24 = 0xffffffff;
      do {
        uVar19 = uVar24 + 1;
        pBVar22 = (this->breakpoints).data.
                  super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_e8 = dVar35;
        local_d8 = piVar30;
        if (iVar11 < (int)uVar19) {
          iVar11 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                             (pBVar22,&local_50,iVar11 + 1,nBp,4,0,0,true);
          pBVar22 = (this->breakpoints).data.
                    super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        iVar1 = *(int *)((long)&pBVar22->val + lVar25);
        pSVar4 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
        if (*(int *)((long)&pBVar22->val + lVar25 + 4) == 0) {
          if (pSVar4->theRep * ((pSVar4->super_SPxBasisBase<double>).thedesc.stat)->data[iVar1] < 1)
          {
            uVar28 = SUB84(ABS(upd_00[iVar1]),0);
            uVar29 = (undefined4)((ulong)ABS(upd_00[iVar1]) >> 0x20);
            pdVar16 = (pSVar4->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar13 = (pSVar4->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            goto LAB_0023bc1c;
          }
          *(undefined4 *)((long)&pBVar22->val + lVar25) = 0xffffffff;
          pUVar21 = pSVar4->thePvec;
LAB_0023bbc6:
          SSVectorBase<double>::clearIdx(&pUVar21->thedelta,iVar1);
          piVar30 = local_d8;
          dVar35 = local_e8;
        }
        else {
          if (0 < pSVar4->theRep *
                  ((pSVar4->super_SPxBasisBase<double>).thedesc.costat)->data[iVar1]) {
            *(undefined4 *)((long)&pBVar22->val + lVar25) = 0xffffffff;
            pUVar21 = pSVar4->theCoPvec;
            goto LAB_0023bbc6;
          }
          uVar28 = SUB84(ABS(upd[iVar1]),0);
          uVar29 = (undefined4)((ulong)ABS(upd[iVar1]) >> 0x20);
          pdVar16 = (pSVar4->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar13 = (pSVar4->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
LAB_0023bc1c:
          piVar30 = (int *)((double)local_d8 -
                           (pdVar13[iVar1] * (double)CONCAT44(uVar29,uVar28) -
                           pdVar16[iVar1] * (double)CONCAT44(uVar29,uVar28)));
          if ((double)CONCAT44(uVar29,uVar28) <= local_e8) {
            uVar28 = SUB84(local_e8,0);
            uVar29 = (undefined4)((ulong)local_e8 >> 0x20);
          }
          dVar35 = (double)CONCAT44(uVar29,uVar28);
        }
        bVar26 = (int)(uVar24 + 2) < nBp;
      } while (((int)(uVar24 + 2) < nBp) &&
              (lVar25 = lVar25 + 0x10, uVar24 = uVar19, 0.0 < (double)piVar30));
    }
    local_e0 = uVar19;
    if ((bVar26) ||
       (pdVar14 = &(this->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta,
       (double)piVar30 < *pdVar14 || (double)piVar30 == *pdVar14)) {
      local_d8 = (int *)(this->breakpoints).data.
                        super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)uVar19].val;
      local_b8 = 0xffffffff;
      lVar25 = (long)(int)uVar19;
      do {
        lVar20 = lVar25 + 1;
        lVar17 = (long)nBp;
        if (lVar17 <= lVar20) break;
        lVar25 = lVar25 * 0x10 + 0x18;
        local_e8 = dVar35;
LAB_0023bd1b:
        pBVar22 = (this->breakpoints).data.
                  super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((long)iVar11 <= lVar20 + -1) {
          iVar11 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                             (pBVar22,&local_50,iVar11 + 1,(int)lVar17,4,0,0,true);
          pBVar22 = (this->breakpoints).data.
                    super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        iVar1 = *(int *)((long)&pBVar22->val + lVar25);
        pSVar4 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
        if (*(int *)((long)&pBVar22->val + lVar25 + 4) == 0) {
          lVar17 = 0x6c0;
          if (0 < pSVar4->theRep * ((pSVar4->super_SPxBasisBase<double>).thedesc.stat)->data[iVar1])
          goto LAB_0023bd9d;
          dVar31 = upd_00[iVar1];
          dVar35 = ABS(dVar31);
          dVar33 = 0.0;
          dVar34 = 0.0;
          if (local_e8 < dVar35) {
            pIVar8 = (pSVar4->thevectors->set).theitem;
            iVar2 = (pSVar4->thevectors->set).thekey[iVar1].idx;
            iVar3 = pIVar8[iVar2].data.super_SVectorBase<double>.memused;
            if (0 < iVar3) {
              pNVar18 = pIVar8[iVar2].data.super_SVectorBase<double>.m_elem;
              uVar19 = iVar3 + 1;
              dVar34 = 0.0;
              do {
                dVar36 = pNVar18->val *
                         (pSVar4->theCoPvec->super_VectorBase<double>).val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[pNVar18->idx];
                dVar32 = dVar33 + dVar36;
                dVar34 = dVar34 + (dVar36 - (dVar32 - dVar33)) +
                                  (dVar33 - (dVar32 - (dVar32 - dVar33)));
                pNVar18 = pNVar18 + 1;
                uVar19 = uVar19 - 1;
                dVar33 = dVar32;
              } while (1 < uVar19);
              dVar33 = dVar32 + dVar34;
            }
            pdVar14 = low_01;
            if (0.0 < dVar31) {
              pdVar14 = upp_01;
            }
            (pSVar4->thePvec->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar1] = dVar33;
            dVar33 = pdVar14[iVar1];
            pdVar14 = pdVar23;
            goto LAB_0023befa;
          }
        }
        else {
          lVar17 = 0x6b8;
          if (0 < pSVar4->theRep *
                  ((pSVar4->super_SPxBasisBase<double>).thedesc.costat)->data[iVar1])
          goto LAB_0023bd9d;
          dVar31 = upd[iVar1];
          dVar35 = ABS(dVar31);
          dVar34 = 0.0;
          if (local_e8 < dVar35) {
            pdVar14 = low;
            if (0.0 < dVar31) {
              pdVar14 = upp;
            }
            dVar33 = pdVar14[iVar1];
            pdVar14 = vec;
LAB_0023befa:
            dVar34 = (dVar33 - pdVar14[iVar1]) / dVar31;
            if (dVar34 <= (double)local_d8) {
              local_b8 = (uint)lVar20;
              local_e8 = dVar35;
            }
          }
        }
        lVar25 = lVar20;
        dVar35 = local_e8;
      } while (dVar34 <= (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta +
                         (double)local_d8);
LAB_0023bf34:
      local_d8 = (int *)(this->super_SPxFastRT<double>).fastDelta;
      peVar9 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>._tolerances.
               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      bVar26 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
               instableLeave;
      this_00 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>._tolerances.
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        dVar31 = peVar9->s_epsilon_multiplier;
        uVar27 = -(ulong)(dVar31 == 1.0);
        local_a8 = (double)(~uVar27 & (ulong)(dVar31 * 1e-10) | uVar27 & 0x3ddb7cdfd9d7bdbb);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        dVar31 = peVar9->s_epsilon_multiplier;
        uVar27 = -(ulong)(dVar31 == 1.0);
        local_a8 = (double)(~uVar27 & (ulong)(dVar31 * 1e-10) | uVar27 & 0x3ddb7cdfd9d7bdbb);
        local_e8 = dVar35;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        dVar35 = local_e8;
      }
      if (bVar26 == false) {
        dVar31 = (this->super_SPxFastRT<double>).minStab;
        local_a8 = (double)(-(ulong)(dVar35 < 1000.0) & (ulong)dVar31 |
                           ~-(ulong)(dVar35 < 1000.0) & (ulong)((dVar35 * dVar31) / 1000.0));
      }
      local_d8 = (int *)((double)local_d8 / dVar35);
      if ((int)local_b8 < 0) {
        uVar27 = (ulong)local_e0;
        if (-1 < (int)local_e0) {
          uVar19 = local_e0;
          do {
            while( true ) {
              local_e0 = uVar19;
              pBVar7 = (this->breakpoints).data.
                       super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              iVar11 = pBVar7[uVar27].idx;
              uVar24 = (uint)uVar27;
              if (iVar11 < 0) break;
              bVar26 = pBVar7[uVar27].src != PVEC;
              pdVar14 = upd_00;
              vec_00 = pdVar23;
              low_00 = low_01;
              upp_00 = upp_01;
              if (bVar26) {
                pdVar14 = upd;
                vec_00 = vec;
                low_00 = low;
                upp_00 = upp;
              }
              bVar26 = getData(this,val,&enterId,iVar11,local_a8,(double)local_d8,pdVar14,vec_00,
                               low_00,upp_00,(uint)bVar26,local_c0);
              uVar27 = (ulong)(uVar24 - 1);
              local_e0 = uVar24;
              if ((bVar26) || (uVar19 = uVar24 - 1, (int)uVar24 < 1)) goto LAB_0023c1c3;
            }
            uVar27 = (ulong)(uVar24 - 1);
            uVar19 = local_e0;
          } while (uVar24 != 0);
        }
      }
      else if (local_a8 < dVar35) {
        pBVar7 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar26 = pBVar7[local_b8].src != PVEC;
        if (bVar26) {
          upd_00 = upd;
          pdVar23 = vec;
          low_01 = low;
          upp_01 = upp;
        }
        bVar26 = getData(this,val,&enterId,pBVar7[local_b8].idx,local_a8,(double)local_d8,upd_00,
                         pdVar23,low_01,upp_01,(uint)bVar26,local_c0);
LAB_0023c1c3:
        if (bVar26 != false) {
          this->relax_count = 0;
          SPxFastRT<double>::tighten(&this->super_SPxFastRT<double>);
          if (((long)(int)local_e0 < 1) ||
             (dVar31 = ABS((this->breakpoints).data.
                           super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                           ._M_impl.super__Vector_impl_data._M_start[(int)local_e0].val),
             pdVar23 = &(this->super_SPxFastRT<double>).fastDelta,
             dVar31 < *pdVar23 || dVar31 == *pdVar23)) {
            ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips = 0
            ;
            dVar31 = this->flipPotential + -0.1;
          }
          else {
            flipAndUpdate(this,(int *)&local_e0);
            ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips =
                 local_e0;
            if ((int)local_e0 < 10) {
              dVar31 = this->flipPotential + -0.05;
            }
            else {
              dVar31 = 1.0;
            }
          }
          this->flipPotential = dVar31;
          uVar15._0_4_ = enterId.super_DataKey.info;
          uVar15._4_4_ = enterId.super_DataKey.idx;
          return (SPxId)uVar15;
        }
      }
      if (this->relax_count < 2) {
        SPxFastRT<double>::relax(&this->super_SPxFastRT<double>);
        this->relax_count = this->relax_count + 1;
        *val = local_c0;
        enterId = selectEnter(this,val,local_b4,false);
      }
    }
    else {
      this->flipPotential = this->flipPotential + -0.5;
      *val = local_c0;
      enterId = SPxFastRT<double>::selectEnter(&this->super_SPxFastRT<double>,val,local_b4,false);
    }
  }
  return (SPxId)enterId.super_DataKey;
LAB_0023bd9d:
  *(undefined4 *)((long)&pBVar22->val + lVar25) = 0xffffffff;
  SSVectorBase<double>::clearIdx
            ((SSVectorBase<double> *)
             (*(long *)((long)&(pSVar4->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                               super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                               _vptr_ClassArray + lVar17) + 0x20),iVar1);
  lVar20 = lVar20 + 1;
  lVar17 = (long)nBp;
  lVar25 = lVar25 + 0x10;
  dVar35 = local_e8;
  if (lVar17 <= lVar20) goto LAB_0023bf34;
  goto LAB_0023bd1b;
}

Assistant:

SPxId SPxBoundFlippingRT<R>::selectEnter(
   R&                 val,
   int                   leaveIdx,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::LEAVE);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->leaveCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DLBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(!enableBoundFlips || polish || this->thesolver->rep() == SPxSolverBase<R>::ROW
         || flipPotential <= 0)
   {
      SPxOut::debug(this, "DLBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectEnter(val, leaveIdx, polish);
   }

   const R*  pvec = this->thesolver->pVec().get_const_ptr();
   const R*  pupd = this->thesolver->pVec().delta().values();
   const int*   pidx = this->thesolver->pVec().delta().indexMem();
   int          pupdnnz = this->thesolver->pVec().delta().size();
   const R*  lpb  = this->thesolver->lpBound().get_const_ptr();
   const R*  upb  = this->thesolver->upBound().get_const_ptr();

   const R*  cvec = this->thesolver->coPvec().get_const_ptr();
   const R*  cupd = this->thesolver->coPvec().delta().values();
   const int*   cidx = this->thesolver->coPvec().delta().indexMem();
   int          cupdnnz = this->thesolver->coPvec().delta().size();
   const R*  lcb  = this->thesolver->lcBound().get_const_ptr();
   const R*  ucb  = this->thesolver->ucBound().get_const_ptr();

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid enterId
   SPxId enterId;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMax(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMin(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }

   if(nBp == 0)
   {
      val = max;
      return enterId;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(this->thesolver->fTest()[leaveIdx]);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableLeaveNum >= 0);
      // restore original slope
      slope = spxAbs(this->thesolver->instableLeaveVal);
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int i = breakpoints[npassedBp].idx;

      // compute new slope
      if(breakpoints[npassedBp].src == PVEC)
      {
         if(this->thesolver->isBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(pupd[i]);
            slope -= (this->thesolver->upper(i) * absupd) - (this->thesolver->lower(i) * absupd);

            // get most stable pivot
            if(absupd > moststable)
               moststable = absupd;
         }
      }
      else
      {
         assert(breakpoints[npassedBp].src == COPVEC);

         if(this->thesolver->isCoBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(cupd[i]);
            slope -= (this->thesolver->rhs(i) * absupd) - (this->thesolver->lhs(i) * absupd);

            if(absupd > moststable)
               moststable = absupd;
         }
      }
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DLBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectEnter(val, leaveIdx);
   }

   SPxOut::debug(this, "DLBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int idx = breakpoints[stableBp].idx;

      if(breakpoints[stableBp].src == PVEC)
      {
         if(this->thesolver->isBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(idx);
            continue;
         }

         R x = pupd[idx];

         if(spxAbs(x) > moststable)
         {
            this->thesolver->pVec()[idx] = this->thesolver->vector(idx) * this->thesolver->coPvec();
            stableDelta = (x > 0.0) ? upb[idx] : lpb[idx];
            stableDelta = (stableDelta - pvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }
      else
      {
         if(this->thesolver->isCoBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(idx);
            continue;
         }

         R x = cupd[idx];

         if(spxAbs(x) > moststable)
         {
            stableDelta = (x > 0.0) ? ucb[idx] : lcb[idx];
            stableDelta = (stableDelta - cvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }

      // stop searching if the step length is too big
      if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableLeave;
   assert(!instable || this->thesolver->instableLeaveNum >= 0);
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int idx = breakpoints[bestBp].idx;
         assert(idx >= 0);

         if(breakpoints[bestBp].src == PVEC)
            foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
         else
            foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int idx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(idx >= 0)
         {
            if(breakpoints[npassedBp].src == PVEC)
               foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
            else
               foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(!enterId.isValid());

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DLBFRT04 {}: no valid enterId found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectEnter(val, leaveIdx);
      }
      else
      {
         SPxOut::debug(this, "DLBFRT05 {}: no valid enterId found - breaking...\n",
                       this->thesolver->basis().iteration());
         return enterId;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DLBFRT06 {}: selected Id: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), enterId, nBp);
   return enterId;
}